

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O2

int __thiscall ghc::filesystem::path::compare(path *this,value_type *s)

{
  int iVar1;
  value_type *s_local;
  path local_30;
  
  s_local = s;
  path<char_const*,ghc::filesystem::path>(&local_30,&s_local,auto_format);
  iVar1 = std::__cxx11::string::compare((string *)this);
  std::__cxx11::string::~string((string *)&local_30);
  return iVar1;
}

Assistant:

GHC_INLINE int path::compare(const value_type* s) const
{
    return native().compare(path(s).native());
}